

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

bool CorUnix::CPalSynchronizationManager::HasProcessExited
               (DWORD dwPid,DWORD *pdwExitCode,bool *pfIsActualExitCode)

{
  int iVar1;
  int *piVar2;
  uint local_28;
  DWORD DStack_24;
  bool fRet;
  int iStatus;
  pid_t pidWaitRetval;
  bool *pfIsActualExitCode_local;
  DWORD *pdwExitCode_local;
  DWORD dwPid_local;
  
  _iStatus = pfIsActualExitCode;
  pfIsActualExitCode_local = (bool *)pdwExitCode;
  pdwExitCode_local._4_4_ = dwPid;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  while( true ) {
    DStack_24 = waitpid(pdwExitCode_local._4_4_,(int *)&local_28,1);
    if (DStack_24 == pdwExitCode_local._4_4_) {
      if ((local_28 & 0x7f) == 0) {
        *(int *)pfIsActualExitCode_local = (int)(local_28 & 0xff00) >> 8;
        *_iStatus = true;
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
      }
      else {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        *_iStatus = true;
        pfIsActualExitCode_local[0] = true;
        pfIsActualExitCode_local[1] = false;
        pfIsActualExitCode_local[2] = false;
        pfIsActualExitCode_local[3] = false;
      }
      return true;
    }
    if (DStack_24 == 0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
        return false;
      }
      abort();
    }
    piVar2 = __errno_location();
    if (*piVar2 != 4) break;
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
  }
  piVar2 = __errno_location();
  if (*piVar2 != 10) {
    if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
      piVar2 = __errno_location();
      strerror(*piVar2);
      return false;
    }
    abort();
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    iVar1 = kill(pdwExitCode_local._4_4_,0);
    if (iVar1 == 0) {
      return false;
    }
    piVar2 = __errno_location();
    if (*piVar2 == 3) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      *_iStatus = false;
      pfIsActualExitCode_local[0] = false;
      pfIsActualExitCode_local[1] = false;
      pfIsActualExitCode_local[2] = false;
      pfIsActualExitCode_local[3] = false;
    }
    else {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      piVar2 = __errno_location();
      strerror(*piVar2);
      *_iStatus = false;
      pfIsActualExitCode_local[0] = true;
      pfIsActualExitCode_local[1] = false;
      pfIsActualExitCode_local[2] = false;
      pfIsActualExitCode_local[3] = false;
    }
    return true;
  }
  abort();
}

Assistant:

bool CPalSynchronizationManager::HasProcessExited(
        DWORD dwPid,
        DWORD * pdwExitCode,
        bool * pfIsActualExitCode)
    {
        pid_t pidWaitRetval;
        int iStatus;
        bool fRet = false;

        TRACE("Looking for status of process; trying wait()\n");

        while(1)
        {
            /* try to get state of process, using non-blocking call */
            pidWaitRetval = waitpid(dwPid, &iStatus, WNOHANG);

            if ((DWORD)pidWaitRetval == dwPid)
            {
                /* success; get the exit code */
                if (WIFEXITED(iStatus))
                {
                    *pdwExitCode = WEXITSTATUS(iStatus);
                    *pfIsActualExitCode = true;
                    TRACE("Exit code was %d\n", *pdwExitCode);
                }
                else
                {
                    WARN("Process terminated without exiting; can't get exit "
                         "code. Assuming EXIT_FAILURE.\n");
                    *pfIsActualExitCode = true;
                    *pdwExitCode = EXIT_FAILURE;
                }

                fRet = true;
            }
            else if (0 == pidWaitRetval)
            {
                // The process is still running.
                TRACE("Process %#x is still active.\n", dwPid);
            }
            else
            {
                // A legitimate cause of failure is EINTR; if this happens we
                // have to try again. A second legitimate cause is ECHILD, which
                // happens if we're trying to retrieve the status of a currently-
                // running process that isn't a child of this process.
                if(EINTR == errno)
                {
                    TRACE("waitpid() failed with EINTR; re-waiting\n");
                    continue;
                }
                else if (ECHILD == errno)
                {
                    TRACE("waitpid() failed with ECHILD; calling kill instead\n");
                    if (kill(dwPid, 0) != 0)
                    {
                        if(ESRCH == errno)
                        {
                            WARN("kill() failed with ESRCH, i.e. target "
                                 "process exited and it wasn't a child, "
                                 "so can't get the exit code, assuming  "
                                 "it was 0.\n");
                            *pfIsActualExitCode = false;
                            *pdwExitCode = 0;
                        }
                        else
                        {
                            ERROR("kill(pid, 0) failed; errno is %d (%s)\n",
                                  errno, strerror(errno));
                            *pfIsActualExitCode = false;
                            *pdwExitCode = EXIT_FAILURE;
                        }

                        fRet = true;
                    }
                }
                else
                {
                    // Ignoring unexpected waitpid errno and assuming that
                    // the process is still running
                    ERROR("waitpid(pid=%u) failed with errno=%d (%s)\n",
                          dwPid, errno, strerror(errno));
                }
            }

            // Break out of the loop in all cases except EINTR.
            break;
        }

        return fRet;
    }